

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall spirv_cross::Compiler::expression_is_lvalue(Compiler *this,uint32_t id)

{
  SPIRType *pSVar1;
  SPIRType *type;
  uint32_t id_local;
  Compiler *this_local;
  
  pSVar1 = expression_type(this,id);
  return 2 < *(int *)&(pSVar1->super_IVariant).field_0xc - 0x10U;
}

Assistant:

bool Compiler::expression_is_lvalue(uint32_t id) const
{
	auto &type = expression_type(id);
	switch (type.basetype)
	{
	case SPIRType::SampledImage:
	case SPIRType::Image:
	case SPIRType::Sampler:
		return false;

	default:
		return true;
	}
}